

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test.cpp
# Opt level: O2

bool save_png(char *pFilename,image_u8 *img,bool save_alpha)

{
  uint h;
  uint32_t y;
  uint uVar1;
  uint uVar2;
  pointer puVar3;
  uint uVar4;
  allocator<char> local_59;
  vector<unsigned_char,_std::allocator<unsigned_char>_> pixels;
  string local_40;
  
  uVar2 = img->m_width;
  h = img->m_height;
  pixels.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  pixels.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  pixels.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::resize(&pixels,(ulong)(uVar2 * h * 3))
  ;
  puVar3 = pixels.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
           super__Vector_impl_data._M_start;
  for (uVar1 = 0; uVar1 != h; uVar1 = uVar1 + 1) {
    for (uVar4 = 0; uVar2 != uVar4; uVar4 = uVar4 + 1) {
      *puVar3 = (img->m_pixels).super__Vector_base<color_quad_u8,_std::allocator<color_quad_u8>_>.
                _M_impl.super__Vector_impl_data._M_start[img->m_width * uVar1 + uVar4].m_c[0];
      puVar3[1] = (img->m_pixels).super__Vector_base<color_quad_u8,_std::allocator<color_quad_u8>_>.
                  _M_impl.super__Vector_impl_data._M_start[img->m_width * uVar1 + uVar4].m_c[1];
      puVar3[2] = (img->m_pixels).super__Vector_base<color_quad_u8,_std::allocator<color_quad_u8>_>.
                  _M_impl.super__Vector_impl_data._M_start[img->m_width * uVar1 + uVar4].m_c[2];
      puVar3 = puVar3 + 3;
    }
  }
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_40,pFilename,&local_59);
  uVar2 = lodepng::encode(&local_40,&pixels,uVar2,h,LCT_RGB,8);
  std::__cxx11::string::~string((string *)&local_40);
  std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base
            (&pixels.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>);
  return uVar2 == 0;
}

Assistant:

static bool save_png(const char *pFilename, const image_u8 &img, bool save_alpha)
{
	const uint32_t w = img.width();
	const uint32_t h = img.height();

	std::vector<unsigned char> pixels;
	if (save_alpha)
	{
		pixels.resize(w * h * sizeof(color_quad_u8));
		memcpy(&pixels[0], &img.get_pixels()[0], w * h * sizeof(color_quad_u8));
	}
	else
	{
		pixels.resize(w * h * 3);
		unsigned char *pDst = &pixels[0];
		for (uint32_t y = 0; y < h; y++)
			for (uint32_t x = 0; x < w; x++, pDst += 3)
				pDst[0] = img(x, y)[0], pDst[1] = img(x, y)[1], pDst[2] = img(x, y)[2];
	}
	
	return lodepng::encode(pFilename, pixels, w, h, save_alpha ? LCT_RGBA : LCT_RGB) == 0;
}